

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O3

int bitmap_ior(bitmap_t dst,bitmap_t src1,bitmap_t src2)

{
  ulong uVar1;
  byte bVar2;
  bitmap_el_t *pbVar3;
  bitmap_t pVVar4;
  bitmap_el_t *pbVar5;
  MIR_context_t ctx;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  bitmap_t pVVar7;
  char *pcVar8;
  bitmap_t extraout_RDX;
  char *pcVar9;
  bitmap_t unaff_RBX;
  bitmap_t bm;
  ulong unaff_RBP;
  bitmap_t pVVar10;
  bitmap_t nb;
  bitmap_t nb_00;
  char *pcVar11;
  bitmap_t pVVar12;
  bitmap_t pVVar13;
  bitmap_el_t bVar14;
  ulong uVar15;
  ulong uVar16;
  bitmap_el_t bVar17;
  bitmap_t pVVar18;
  ulong unaff_R12;
  ulong unaff_R13;
  bitmap_t unaff_R14;
  bitmap_t pVVar19;
  bitmap_t unaff_R15;
  undefined8 uVar20;
  bitmap_t pVVar21;
  bitmap_t pVVar22;
  
  if (src1 == (bitmap_t)0x0) {
    bitmap_ior_cold_4();
    nb = src1;
    bm = dst;
LAB_00166050:
    bitmap_ior_cold_3();
    src2 = unaff_R14;
LAB_00166055:
    bitmap_ior_cold_2();
    dst = unaff_RBX;
    src1 = unaff_R15;
  }
  else {
    nb = src1;
    bm = dst;
    unaff_R14 = src2;
    if (src2 == (bitmap_t)0x0) goto LAB_00166050;
    unaff_R13 = src2->els_num;
    unaff_R12 = src1->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (bitmap_t)(unaff_RBP << 6);
    bitmap_expand(dst,(size_t)nb);
    unaff_RBX = dst;
    unaff_R15 = src1;
    if (dst == (bitmap_t)0x0) goto LAB_00166055;
    pbVar3 = dst->varr;
    if (unaff_RBP == 0) {
      if (pbVar3 != (bitmap_el_t *)0x0) {
        uVar16 = 0;
        iVar6 = 0;
        goto LAB_00166039;
      }
    }
    else {
      nb = (bitmap_t)src1->varr;
      bm = (bitmap_t)src2->varr;
      iVar6 = 0;
      uVar16 = 0;
      uVar15 = 0;
      do {
        if (uVar15 < unaff_R12) {
          bVar14 = (&nb->els_num)[uVar15];
        }
        else {
          bVar14 = 0;
        }
        if (uVar15 < unaff_R13) {
          bVar17 = (&bm->els_num)[uVar15];
        }
        else {
          bVar17 = 0;
        }
        src2 = (bitmap_t)pbVar3[uVar15];
        pVVar18 = (bitmap_t)(bVar17 | bVar14);
        uVar1 = uVar15 + 1;
        if (pVVar18 != (bitmap_t)0x0) {
          uVar16 = uVar1;
        }
        pbVar3[uVar15] = (bitmap_el_t)pVVar18;
        if (src2 != pVVar18) {
          iVar6 = 1;
        }
        uVar15 = uVar1;
      } while (unaff_RBP != uVar1);
      if (uVar16 <= dst->els_num) {
LAB_00166039:
        dst->els_num = uVar16;
        return iVar6;
      }
    }
  }
  bitmap_ior_cold_1();
  uVar20 = extraout_RAX;
  pVVar18 = dst;
  pVVar22 = src1;
  if (nb == (bitmap_t)0x0) {
    pVVar21 = src2;
    bitmap_and_compl_cold_4();
    nb_00 = nb;
    pVVar13 = bm;
    pVVar19 = src2;
    src2 = pVVar21;
LAB_00166118:
    bitmap_and_compl_cold_3();
  }
  else {
    nb_00 = nb;
    pVVar13 = bm;
    pVVar19 = extraout_RDX;
    if (extraout_RDX == (bitmap_t)0x0) goto LAB_00166118;
    pVVar21 = (bitmap_t)extraout_RDX->els_num;
    pVVar4 = (bitmap_t)nb->els_num;
    pVVar10 = pVVar21;
    if (pVVar21 < pVVar4) {
      pVVar10 = pVVar4;
    }
    nb_00 = (bitmap_t)((long)pVVar10 << 6);
    bitmap_expand(bm,(size_t)nb_00);
    dst = bm;
    pVVar19 = extraout_RDX;
    src1 = nb;
    if (bm != (bitmap_t)0x0) {
      pbVar3 = bm->varr;
      if (pVVar10 == (bitmap_t)0x0) {
        if (pbVar3 != (bitmap_el_t *)0x0) {
          pVVar7 = (bitmap_t)0x0;
          goto LAB_00166101;
        }
      }
      else {
        pbVar5 = nb->varr;
        nb_00 = (bitmap_t)extraout_RDX->varr;
        pVVar7 = (bitmap_t)0x0;
        pVVar12 = (bitmap_t)0x0;
        do {
          if (pVVar12 < pVVar4) {
            bVar14 = pbVar5[(long)pVVar12];
          }
          else {
            bVar14 = 0;
          }
          uVar16 = 0xffffffffffffffff;
          if (pVVar12 < pVVar21) {
            uVar16 = ~(&nb_00->els_num)[(long)pVVar12];
          }
          pVVar13 = (bitmap_t)((long)&pVVar12->els_num + 1);
          if ((uVar16 & bVar14) != 0) {
            pVVar7 = pVVar13;
          }
          pbVar3[(long)pVVar12] = uVar16 & bVar14;
          pVVar12 = pVVar13;
        } while (pVVar10 != pVVar13);
        if (pVVar7 <= (bitmap_t)bm->els_num) {
LAB_00166101:
          bm->els_num = (size_t)pVVar7;
          return (int)pbVar3;
        }
      }
      goto LAB_00166122;
    }
  }
  bitmap_and_compl_cold_2();
  bm = dst;
  nb = src1;
LAB_00166122:
  bitmap_and_compl_cold_1();
  if (((FILE *)pVVar13[1].els_num != (FILE *)0x0) && (1 < (int)pVVar13[1].size)) {
    bVar2 = *(byte *)((long)&nb_00->size + 1);
    pcVar11 = "may/must alloca ";
    ctx = (MIR_context_t)pVVar13->els_num;
    if ((bVar2 & 3) == 0) {
      pcVar11 = "must alloca";
    }
    pcVar8 = "const val";
    pcVar9 = "";
    if (bVar2 != 0) {
      pcVar9 = pcVar11;
    }
    if ((char)nb_00->size == '\0') {
      pcVar8 = "val";
    }
    fprintf((FILE *)pVVar13[1].els_num,"%s%s=%lld for insn %lu:",pcVar9,pcVar8,nb_00[1].els_num,
            (ulong)*(uint *)((long)&nb_00->size + 4),bm,pVVar19,nb,uVar20,pVVar18,unaff_R12,
            unaff_R13,src2,pVVar22,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar13[1].els_num,(MIR_insn_t_conflict)nb_00->els_num,
                    (MIR_func_t)pVVar13->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static inline int bitmap_ior (bitmap_t dst, bitmap_t src1, bitmap_t src2) {
  return bitmap_op2 (dst, src1, src2, bitmap_el_ior);
}